

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicStore(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  TranslateToFuzzReader *type_00;
  bool bVar2;
  int8_t iVar3;
  Index IVar4;
  BasicType BVar5;
  uint uVar6;
  Expression *pEVar7;
  reference pvVar8;
  pointer pMVar9;
  Address local_1c0;
  TranslateToFuzzReader *local_1b8;
  size_t local_1b0;
  char *local_1a8;
  Type local_1a0;
  Address local_198;
  size_t local_190;
  char *local_188;
  Type local_180;
  Address local_178;
  size_t local_170;
  char *local_168;
  Type local_160;
  Address local_158;
  size_t local_150;
  char *local_148;
  Type local_140;
  Address local_138;
  size_t local_130;
  char *local_128;
  Type local_120;
  Address local_118;
  size_t local_110;
  char *local_108;
  Type local_100;
  Address local_f8;
  size_t local_f0;
  char *local_e8;
  Type local_e0;
  Address local_d8;
  size_t local_d0;
  char *local_c8;
  Type local_c0;
  Address local_b8;
  size_t local_b0;
  char *local_a8;
  Type local_a0;
  Address local_98;
  TranslateToFuzzReader *local_90;
  Expression *local_88;
  Expression *value;
  Expression *ptr;
  Type TStack_70;
  Index offset;
  BasicType local_64;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Store *local_40;
  Store *store;
  Expression *local_30;
  Expression *ret;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ret._4_4_ = 1;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar2 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ret + 4));
  if (bVar2) {
    store = (Store *)getStorableType(this);
    local_30 = makeNonAtomicStore(this,(Type)store);
    local_40 = Expression::dynCast<wasm::Store>(local_30);
    if (local_40 == (Store *)0x0) {
      type_local.id = (uintptr_t)local_30;
    }
    else {
      IVar4 = upTo(this,3);
      if (IVar4 == 0) {
        Type::Type(&local_48,unreachable);
        pEVar7 = make(this,local_48);
        local_40->ptr = pEVar7;
      }
      else if (IVar4 == 1) {
        Type::Type(&local_50,unreachable);
        pEVar7 = make(this,local_50);
        local_40->value = pEVar7;
      }
      else if (IVar4 == 2) {
        Type::Type(&local_58,unreachable);
        pEVar7 = make(this,local_58);
        local_40->ptr = pEVar7;
        Type::Type(&local_60,unreachable);
        pEVar7 = make(this,local_60);
        local_40->value = pEVar7;
      }
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      Name::operator=(&local_40->memory,(Name *)pMVar9);
      wasm::Store::finalize();
      type_local.id = (uintptr_t)local_40;
    }
  }
  else {
    local_64 = none;
    bVar2 = Type::operator==((Type *)&this_local,&local_64);
    if (bVar2) {
      TStack_70 = getStorableType(this);
      this_local = (TranslateToFuzzReader *)TStack_70;
    }
    iVar3 = get(this);
    ptr._4_4_ = logify(this,(int)iVar3);
    value = makePointer(this);
    local_90 = this_local;
    local_88 = make(this,(Type)this_local);
    BVar5 = Type::getBasic((Type *)&this_local);
    switch(BVar5) {
    case none:
    case unreachable:
      wasm::handle_unreachable
                ("invalid type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xbf1);
    case i32:
      IVar4 = upTo(this,3);
      if (IVar4 == 0) {
        Address::Address(&local_98,(ulong)ptr._4_4_);
        pEVar1 = value;
        pEVar7 = local_88;
        local_a0.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_b0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_a8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,1,local_98,1,pEVar1,pEVar7,local_a0,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
      }
      else if (IVar4 == 1) {
        Address::Address(&local_b8,(ulong)ptr._4_4_);
        uVar6 = pick<int,int>(this,1,2);
        pEVar1 = value;
        pEVar7 = local_88;
        local_c0.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_d0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_c8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,2,local_b8,uVar6,pEVar1,pEVar7,local_c0,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
      }
      else {
        if (IVar4 != 2) {
          wasm::handle_unreachable
                    ("invalid value",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xbc3);
        }
        Address::Address(&local_d8,(ulong)ptr._4_4_);
        uVar6 = pick<int,int,int>(this,1,2,4);
        pEVar1 = value;
        pEVar7 = local_88;
        local_e0.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_f0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_e8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,4,local_d8,uVar6,pEVar1,pEVar7,local_e0,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
      }
      break;
    case i64:
      IVar4 = upTo(this,4);
      switch(IVar4) {
      case 0:
        Address::Address(&local_f8,(ulong)ptr._4_4_);
        pEVar1 = value;
        pEVar7 = local_88;
        local_100.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_110 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_108 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,1,local_f8,1,pEVar1,pEVar7,local_100,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
        break;
      case 1:
        Address::Address(&local_118,(ulong)ptr._4_4_);
        uVar6 = pick<int,int>(this,1,2);
        pEVar1 = value;
        pEVar7 = local_88;
        local_120.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_130 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_128 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,2,local_118,uVar6,pEVar1,pEVar7,local_120,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
        break;
      case 2:
        Address::Address(&local_138,(ulong)ptr._4_4_);
        uVar6 = pick<int,int,int>(this,1,2,4);
        pEVar1 = value;
        pEVar7 = local_88;
        local_140.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_150 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_148 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,4,local_138,uVar6,pEVar1,pEVar7,local_140,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
        break;
      case 3:
        Address::Address(&local_158,(ulong)ptr._4_4_);
        uVar6 = pick<int,int,int,int>(this,1,2,4,8);
        pEVar1 = value;
        pEVar7 = local_88;
        local_160.id = (uintptr_t)this_local;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        local_170 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
        local_168 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,8,local_158,uVar6,pEVar1,pEVar7,local_160,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
        break;
      default:
        wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xbd9);
      }
      break;
    case f32:
      Address::Address(&local_178,(ulong)ptr._4_4_);
      uVar6 = pick<int,int,int>(this,1,2,4);
      pEVar1 = value;
      pEVar7 = local_88;
      local_180.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_190 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_188 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeStore(&this->builder,4,local_178,uVar6,pEVar1,pEVar7,local_180,
                              (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
      break;
    case f64:
      Address::Address(&local_198,(ulong)ptr._4_4_);
      uVar6 = pick<int,int,int,int>(this,1,2,4,8);
      pEVar1 = value;
      pEVar7 = local_88;
      local_1a0.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_1b0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_1a8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeStore(&this->builder,8,local_198,uVar6,pEVar1,pEVar7,local_1a0,
                              (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
      break;
    case v128:
      bVar2 = FeatureSet::hasSIMD(&this->wasm->features);
      if (bVar2) {
        Address::Address(&local_1c0,(ulong)ptr._4_4_);
        uVar6 = pick<int,int,int,int,int>(this,1,2,4,8,0x10);
        type_00 = this_local;
        pEVar1 = value;
        pEVar7 = local_88;
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        type_local.id =
             (uintptr_t)
             Builder::makeStore(&this->builder,0x10,local_1c0,uVar6,pEVar1,pEVar7,(Type)type_00,
                                (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str)
        ;
      }
      else {
        local_1b8 = this_local;
        type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
      }
      break;
    default:
      wasm::handle_unreachable
                ("invalid type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xbf3);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicStore(Type type) {
  if (type == Type::unreachable) {
    // make a normal store, then make it unreachable
    auto* ret = makeNonAtomicStore(getStorableType());
    auto* store = ret->dynCast<Store>();
    if (!store) {
      return ret;
    }
    switch (upTo(3)) {
      case 0:
        store->ptr = make(Type::unreachable);
        break;
      case 1:
        store->value = make(Type::unreachable);
        break;
      case 2:
        store->ptr = make(Type::unreachable);
        store->value = make(Type::unreachable);
        break;
    }
    store->memory = wasm.memories[0]->name;
    store->finalize();
    return store;
  }
  // the type is none or unreachable. we also need to pick the value
  // type.
  if (type == Type::none) {
    type = getStorableType();
  }
  auto offset = logify(get());
  auto ptr = makePointer();
  auto value = make(type);
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          return builder.makeStore(
            1, offset, 1, ptr, value, type, wasm.memories[0]->name);
        case 1:
          return builder.makeStore(
            2, offset, pick(1, 2), ptr, value, type, wasm.memories[0]->name);
        case 2:
          return builder.makeStore(
            4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          return builder.makeStore(
            1, offset, 1, ptr, value, type, wasm.memories[0]->name);
        case 1:
          return builder.makeStore(
            2, offset, pick(1, 2), ptr, value, type, wasm.memories[0]->name);
        case 2:
          return builder.makeStore(
            4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
        case 3:
          return builder.makeStore(8,
                                   offset,
                                   pick(1, 2, 4, 8),
                                   ptr,
                                   value,
                                   type,
                                   wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f32: {
      return builder.makeStore(
        4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeStore(
        8, offset, pick(1, 2, 4, 8), ptr, value, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeStore(16,
                               offset,
                               pick(1, 2, 4, 8, 16),
                               ptr,
                               value,
                               type,
                               wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}